

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O2

void Gia_ManInseInit(Gia_Man_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  ulong uVar4;
  int i;
  undefined8 *puVar5;
  bool bVar6;
  
  i = 0;
  while( true ) {
    if (p->nRegs <= i) {
      return;
    }
    pObj = Gia_ManCo(p,(i - p->nRegs) + p->vCos->nSize);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(p,pObj);
    iVar1 = p->iData;
    puVar5 = (undefined8 *)((long)(iVar1 * iVar2 * 2) * 8 + (long)p->pData);
    iVar2 = Vec_IntEntry(vInit,i);
    if (iVar2 == 0) {
      uVar4 = (ulong)(uint)p->iData;
      if (p->iData < 1) {
        uVar4 = 0;
      }
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        puVar5[uVar3] = 0xffffffffffffffff;
        puVar5[(long)iVar1 + uVar3] = 0;
      }
    }
    else {
      iVar2 = Vec_IntEntry(vInit,i);
      uVar4 = (ulong)(uint)p->iData;
      if (p->iData < 1) {
        uVar4 = 0;
      }
      if (iVar2 == 1) {
        for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          puVar5[uVar3] = 0;
          puVar5[(long)iVar1 + uVar3] = 0xffffffffffffffff;
        }
      }
      else {
        while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
          puVar5[iVar1] = 0;
          *puVar5 = 0;
          puVar5 = puVar5 + 1;
        }
      }
    }
    i = i + 1;
  }
  return;
}

Assistant:

void Gia_ManInseInit( Gia_Man_t * p, Vec_Int_t * vInit )
{
    Gia_Obj_t * pObj;
    word * pData1, * pData0;
    int i, k;
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        if ( Vec_IntEntry(vInit, k) == 0 ) // 0
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = ~(word)0, pData1[i] = 0;
        else if ( Vec_IntEntry(vInit, k) == 1 ) // 1
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = 0, pData1[i] = ~(word)0;
        else // if ( Vec_IntEntry(vInit, k) > 1 ) // X
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pData1[i] = 0;
    }
}